

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

void __thiscall
icu_63::HebrewCalendar::handleComputeFields
          (HebrewCalendar *this,int32_t julianDay,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int value;
  short local_6a;
  short local_62;
  int dayOfMonth;
  int32_t momax;
  int32_t month;
  int iStack_3c;
  UBool isLeap;
  int32_t type;
  int32_t dayOfYear;
  int32_t ys;
  int32_t year;
  double m;
  int32_t d;
  UErrorCode *status_local;
  int32_t julianDay_local;
  HebrewCalendar *this_local;
  
  dayOfYear = (int32_t)(((((double)(julianDay + -0x54f5d) * 25920.0) / 765433.0) * 19.0 + 234.0) /
                        235.0 + 1.0);
  iStack_3c = startOfYear(dayOfYear,status);
  while (iStack_3c = (julianDay + -0x54f5d) - iStack_3c, iStack_3c < 1) {
    dayOfYear = dayOfYear + -1;
    iStack_3c = startOfYear(dayOfYear,status);
  }
  iVar3 = yearType(this,dayOfYear);
  UVar2 = isLeapYear(dayOfYear);
  dayOfMonth = 0;
  while( true ) {
    bVar1 = false;
    if (dayOfMonth < 0xe) {
      if (UVar2 == '\0') {
        local_62 = MONTH_START[dayOfMonth][iVar3];
      }
      else {
        local_62 = LEAP_MONTH_START[dayOfMonth][iVar3];
      }
      bVar1 = local_62 < iStack_3c;
    }
    if (!bVar1) break;
    dayOfMonth = dayOfMonth + 1;
  }
  if ((dayOfMonth < 0xe) && (0 < dayOfMonth)) {
    value = dayOfMonth + -1;
    if (UVar2 == '\0') {
      local_6a = MONTH_START[value][iVar3];
    }
    else {
      local_6a = LEAP_MONTH_START[value][iVar3];
    }
    Calendar::internalSet(&this->super_Calendar,UCAL_ERA,0);
    Calendar::internalSet(&this->super_Calendar,UCAL_YEAR,dayOfYear);
    Calendar::internalSet(&this->super_Calendar,UCAL_EXTENDED_YEAR,dayOfYear);
    Calendar::internalSet(&this->super_Calendar,UCAL_MONTH,value);
    Calendar::internalSet(&this->super_Calendar,UCAL_DATE,iStack_3c - local_6a);
    Calendar::internalSet(&this->super_Calendar,UCAL_DAY_OF_YEAR,iStack_3c);
  }
  else {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return;
}

Assistant:

void HebrewCalendar::handleComputeFields(int32_t julianDay, UErrorCode &status) {
    int32_t d = julianDay - 347997;
    double m = ((d * (double)DAY_PARTS)/ (double) MONTH_PARTS);         // Months (approx)
    int32_t year = (int32_t)( ((19. * m + 234.) / 235.) + 1.);     // Years (approx)
    int32_t ys  = startOfYear(year, status);                   // 1st day of year
    int32_t dayOfYear = (d - ys);

    // Because of the postponement rules, it's possible to guess wrong.  Fix it.
    while (dayOfYear < 1) {
        year--;
        ys  = startOfYear(year, status);
        dayOfYear = (d - ys);
    }

    // Now figure out which month we're in, and the date within that month
    int32_t type = yearType(year);
    UBool isLeap = isLeapYear(year);

    int32_t month = 0;
    int32_t momax = UPRV_LENGTHOF(MONTH_START);
    while (month < momax && dayOfYear > (  isLeap ? LEAP_MONTH_START[month][type] : MONTH_START[month][type] ) ) {
        month++;
    }
    if (month >= momax || month<=0) {
        // TODO: I found dayOfYear could be out of range when
        // a large value is set to julianDay.  I patched startOfYear
        // to reduce the chace, but it could be still reproduced either
        // by startOfYear or other places.  For now, we check
        // the month is in valid range to avoid out of array index
        // access problem here.  However, we need to carefully review
        // the calendar implementation to check the extreme limit of
        // each calendar field and the code works well for any values
        // in the valid value range.  -yoshito
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    month--;
    int dayOfMonth = dayOfYear - (isLeap ? LEAP_MONTH_START[month][type] : MONTH_START[month][type]);

    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);       
}